

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

IF97BACKREGIONS IF97::RegionDetermination_HS(double h,double s)

{
  int iVar1;
  out_of_range *poVar2;
  double dVar3;
  double dVar4;
  double P;
  double PB23;
  double TB23;
  double s_local;
  double h_local;
  
  if (RegionDetermination_HS(double,double)::b13 == '\0') {
    iVar1 = __cxa_guard_acquire(&RegionDetermination_HS(double,double)::b13);
    if (iVar1 != 0) {
      Backwards::Boundary13HS::Boundary13HS(&RegionDetermination_HS::b13);
      __cxa_atexit(Backwards::Boundary13HS::~Boundary13HS,&RegionDetermination_HS::b13,&__dso_handle
                  );
      __cxa_guard_release(&RegionDetermination_HS(double,double)::b13);
    }
  }
  if (RegionDetermination_HS(double,double)::b23hs == '\0') {
    iVar1 = __cxa_guard_acquire(&RegionDetermination_HS(double,double)::b23hs);
    if (iVar1 != 0) {
      Backwards::Boundary23HS::Boundary23HS(&RegionDetermination_HS::b23hs);
      __cxa_atexit(Backwards::Boundary23HS::~Boundary23HS,&RegionDetermination_HS::b23hs,
                   &__dso_handle);
      __cxa_guard_release(&RegionDetermination_HS(double,double)::b23hs);
    }
  }
  if (RegionDetermination_HS(double,double)::R2c == '\0') {
    iVar1 = __cxa_guard_acquire(&RegionDetermination_HS(double,double)::R2c);
    if (iVar1 != 0) {
      Backwards::Region2cHS::Region2cHS(&RegionDetermination_HS::R2c);
      __cxa_atexit(Backwards::Region2cHS::~Region2cHS,&RegionDetermination_HS::R2c,&__dso_handle);
      __cxa_guard_release(&RegionDetermination_HS(double,double)::R2c);
    }
  }
  if ((0.0 <= s) && (s <= 11.921054825051103)) {
    dVar3 = Hmax(s);
    if (h <= dVar3) {
      dVar3 = Hmin(s);
      if (dVar3 <= h) {
        if (3.77828134 < s) {
          if (4.41202148223476 < s) {
            if (5.048096828 < s) {
              if (5.260578707 < s) {
                if (5.85 < s) {
                  if (9.155492076509681 <= s) {
                    h_local._4_4_ = BACK_2A;
                  }
                  else {
                    dVar3 = Backwards::Hsat_s(s);
                    if (dVar3 <= h) {
                      dVar3 = Backwards::H2ab_s(s);
                      if (h <= dVar3) {
                        h_local._4_4_ = BACK_2A;
                      }
                      else {
                        h_local._4_4_ = BACK_2B;
                      }
                    }
                    else {
                      h_local._4_4_ = BACK_4;
                    }
                  }
                }
                else {
                  dVar3 = Backwards::Hsat_s(s);
                  if (dVar3 <= h) {
                    h_local._4_4_ = BACK_2C;
                  }
                  else {
                    h_local._4_4_ = BACK_4;
                  }
                }
              }
              else {
                dVar3 = Backwards::Hsat_s(s);
                if (dVar3 <= h) {
                  if (2563.592004 <= h) {
                    if (h <= 2812.942061) {
                      dVar3 = Backwards::BackwardsRegion::t_hs
                                        (&RegionDetermination_HS::b23hs.super_BackwardsRegion,h,s);
                      dVar3 = Region23_T(dVar3);
                      dVar4 = Backwards::BackwardsRegion::p_hs
                                        (&RegionDetermination_HS::R2c.super_BackwardsRegion,h,s);
                      if (dVar4 <= dVar3) {
                        h_local._4_4_ = BACK_2C;
                      }
                      else {
                        h_local._4_4_ = BACK_3B;
                      }
                    }
                    else {
                      h_local._4_4_ = BACK_2C;
                    }
                  }
                  else {
                    h_local._4_4_ = BACK_3B;
                  }
                }
                else {
                  h_local._4_4_ = BACK_4;
                }
              }
            }
            else {
              dVar3 = Backwards::Hsat_s(s);
              if (dVar3 <= h) {
                h_local._4_4_ = BACK_3B;
              }
              else {
                h_local._4_4_ = BACK_4;
              }
            }
          }
          else {
            dVar3 = Backwards::Hsat_s(s);
            if (dVar3 <= h) {
              h_local._4_4_ = BACK_3A;
            }
            else {
              h_local._4_4_ = BACK_4;
            }
          }
        }
        else {
          dVar3 = Backwards::Hsat_s(s);
          if (dVar3 <= h) {
            if (3.397782955 <= s) {
              dVar3 = Backwards::BackwardsRegion::h_s
                                (&RegionDetermination_HS::b13.super_BackwardsRegion,s);
              if (dVar3 <= h) {
                h_local._4_4_ = BACK_3A;
              }
              else {
                h_local._4_4_ = BACK_1;
              }
            }
            else {
              h_local._4_4_ = BACK_1;
            }
          }
          else {
            h_local._4_4_ = BACK_4;
          }
        }
        return h_local._4_4_;
      }
    }
    poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar2,"Enthalpy out of range");
    __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(poVar2,"Entropy out of range");
  __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline IF97BACKREGIONS RegionDetermination_HS(double h, double s){
        static Backwards::Boundary13HS b13;
        static Backwards::Boundary23HS b23hs;
        static Backwards::Region2cHS R2c;

        // Check Overall Boundaries
        if ( (s < Smin) || (s > Smax) ) 
            throw std::out_of_range("Entropy out of range");
        if ( (h > Hmax(s)) || (h < Hmin(s)) )
            throw std::out_of_range("Enthalpy out of range");

        // ============================================================================
        // Start at the low entropy curves and work our way up.
        // =================================== Region 1 Check =========================
        if (s <= SfT23){
            if (h < Backwards::Hsat_s(s))     //   If below Saturated Liquid Curve
                return BACK_4;                //       REGION 4
            else if (s < S13min)              //   If below H13 Curve
                return BACK_1;                //       REGION 1
            else {                            //   IF within H13 Curve (S13min < s < SfT23)
                if (h < b13.h_s(s))           //       below curve
                    return BACK_1;            //           REGION 1
                else                          //       above curve
                    return BACK_3A;           //           REGION 3 
                 }                            //
        } else if (s <= Scrit){  //========== Region 3a Check (S < Scrit) ==============
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Liquid Curve
                return BACK_4;                //      REGION 4
            else                              //  If above curve
                return BACK_3A;               //      REGION 3(a)
        } else if (s <= S23min){  //========== Region 3b Check            ==============
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Liquid Curve
                return BACK_4;                //      REGION 4
            else                              //  If above curve
                return BACK_3B;               //      REGION 3(a)
        } else if (s <= S23max){  //========== Region 3b/2c Check Along B23 Curve ======
            if (h < Backwards::Hsat_s(s))     //  if below Saturated Vapor Curve
                return BACK_4;                //      REGION 4
            else if (h < H23min)              //  if below bounding box
                return BACK_3B;               //      REGION 3(b)
            else if (h > H23max)              //  if above bounding box
                return BACK_2C;               //      REGION 2(c)
            else {                            //  Need to check TB23 Curve
                double TB23 = b23hs.t_hs(h,s);       //  Calc TB23(h,s)
                double PB23 = Region23_T(TB23);      //  Calc Corresponding PB23
                double P    = R2c.p_hs(h,s);         //  Calc P(h,s) using Region 2c
                if (P > PB23)                        //  Above B23 Curve
                    return BACK_3B;                  //      REGION 3(b)
                else                                 //  Below B23 Curve
                    return BACK_2C;                  //      REGION 2(c)
            } 
        } else if (s <= S2bc){   //========== Region 3b Check            ==============
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Liquid Curve
                return BACK_4;                //      REGION 4
            else                              //  If above curve
                return BACK_2C;               //      REGION 2(c)
        } else if (s < Sgtrip) { //========== Region 2a/2b (s > S2bc) above Sat. Curve ==
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Vapor Curve
                return BACK_4;                //      REGION_4
            else {                            //  If above Curve then
                if (h > Backwards::H2ab_s(s))   //      if h > h2ab(s) Curve (P=4 MPa)
                    return BACK_2B;             //          REGION 2(b)
                else                            //      if h < h2ab(s) Curve (P=4 MPa)
                    return BACK_2A;             //          REGION 2(a)
            }
        } else
            return BACK_2A;      //========== Region 2a fall thru ========================
    }